

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::SetEntityLinearVelocityFlag(TSPI_PDU *this,KBOOL F)

{
  KBOOL F_local;
  TSPI_PDU *this_local;
  
  if (F != (KBOOL)((this->m_TSPIFlagUnion).m_ui8Flag & 1)) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xfe | F;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 6;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 6;
    }
  }
  return;
}

Assistant:

void TSPI_PDU::SetEntityLinearVelocityFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8LinVel )return;

    m_TSPIFlagUnion.m_ui8LinVel = F;

    if( F )
    {
        m_ui16PDULength += LE_Vector16_3::LE_VECTOR_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_Vector16_3::LE_VECTOR_SIZE;
    }
}